

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<absl::lts_20250127::btree_set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,void>
               (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *container,ostream *os)

{
  bool bVar1;
  reference value;
  long lVar2;
  const_iterator other;
  const_iterator cVar3;
  char local_49;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
  local_48;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_38;
  
  local_48.node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
        *)CONCAT71(local_48.node_._1_7_,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
  cVar3 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
          ::begin((btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                   *)container);
  local_48.node_ = cVar3.node_;
  local_48.position_ = cVar3.position_;
  cVar3 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
          ::end((btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                 *)container);
  local_38 = cVar3.node_;
  other.position_ = cVar3.position_;
  bVar1 = absl::lts_20250127::container_internal::
          btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
          ::Equals(&local_48,cVar3);
  if (!bVar1) {
    lVar2 = 0;
    do {
      value = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
              ::operator*(&local_48);
      if (lVar2 != 0) {
        local_49 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_49,1);
        if (lVar2 == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_0060719b;
        }
      }
      local_49 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_49,1);
      UniversalPrinter<std::basic_string_view<char,_std::char_traits<char>_>_>::Print(value,os);
      lVar2 = lVar2 + 1;
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
      ::increment(&local_48);
      other.node_ = local_38;
      other._12_4_ = 0;
      bVar1 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
              ::Equals(&local_48,other);
    } while (!bVar1);
    if (lVar2 != 0) {
LAB_0060719b:
      local_48.node_ =
           (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
            *)CONCAT71(local_48.node_._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
    }
  }
  local_48.node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
        *)CONCAT71(local_48.node_._1_7_,0x7d);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }